

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Draw_Sweep(black_PWorker worker)

{
  int iVar1;
  long lVar2;
  PProfile_conflict pTStack_90;
  Int dropOutControl;
  TProfileList draw_right;
  TProfileList draw_left;
  TProfileList waiting;
  Long e2;
  Long e1;
  Long xs;
  Long x2;
  Long x1;
  short local_48;
  short local_46;
  short local_44;
  Short dropouts;
  Short bottom;
  Short top;
  Short max_Y;
  Short min_Y;
  PProfile_conflict P_Right;
  PProfile_conflict P_Left;
  PProfile_conflict Q;
  PProfile_conflict P;
  Short y_height;
  Short y_change;
  black_PWorker pbStack_18;
  Short y;
  black_PWorker worker_local;
  
  pbStack_18 = worker;
  Init_Linked(&draw_left);
  Init_Linked(&draw_right);
  Init_Linked(&stack0xffffffffffffff70);
  local_44 = (short)(pbStack_18->minY >> ((byte)pbStack_18->precision_bits & 0x3f));
  dropouts = (Short)(pbStack_18->maxY >> ((byte)pbStack_18->precision_bits & 0x3f));
  Q = pbStack_18->fProfile;
  while (Q != (PProfile_conflict)0x0) {
    P_Left = Q->link;
    local_48 = (short)Q->start;
    local_46 = (short)Q->start + (short)Q->height + -1;
    if (local_48 < dropouts) {
      dropouts = local_48;
    }
    if (local_44 < local_46) {
      local_44 = local_46;
    }
    Q->X = 0;
    InsNew(&draw_left,Q);
    Q = P_Left;
  }
  if (pbStack_18->numTurns == 0) {
    pbStack_18->error = 0x14;
    worker_local._7_1_ = '\x01';
  }
  else {
    (*pbStack_18->Proc_Sweep_Init)(pbStack_18,&dropouts,&local_44);
    for (Q = draw_left; Q != (PProfile_conflict)0x0; Q = Q->link) {
      Q->countL = (int)Q->start - (int)dropouts;
    }
    P._6_2_ = dropouts;
    P._2_2_ = 0;
    if ((0 < pbStack_18->numTurns) &&
       (pbStack_18->sizeBuff[-pbStack_18->numTurns] == (long)dropouts)) {
      pbStack_18->numTurns = pbStack_18->numTurns + -1;
    }
    while (0 < pbStack_18->numTurns) {
      Q = draw_left;
      while (Q != (PProfile_conflict)0x0) {
        P_Left = Q->link;
        Q->countL = Q->countL - (int)P._2_2_;
        if (Q->countL == 0) {
          DelOld(&draw_left,Q);
          if ((Q->flags & 8) == 0) {
            InsNew(&stack0xffffffffffffff70,Q);
          }
          else {
            InsNew(&draw_right,Q);
          }
        }
        Q = P_Left;
      }
      Sort(&draw_right);
      Sort(&stack0xffffffffffffff70);
      iVar1 = pbStack_18->numTurns;
      pbStack_18->numTurns = iVar1 + -1;
      P._4_2_ = (short)pbStack_18->sizeBuff[-iVar1];
      P._2_2_ = P._4_2_ - P._6_2_;
      while (P._6_2_ < P._4_2_) {
        x1._6_2_ = 0;
        _bottom = pTStack_90;
        for (P_Right = draw_right; P_Right != (PProfile_conflict)0x0; P_Right = P_Right->link) {
          x2 = P_Right->X;
          lVar2 = _bottom->X;
          xs = lVar2;
          if (lVar2 < x2) {
            e1 = x2;
            xs = x2;
            x2 = lVar2;
          }
          e2 = x2 & -pbStack_18->precision;
          waiting = (TProfileList)((xs + pbStack_18->precision) - 1U & (long)-pbStack_18->precision)
          ;
          if (((((long)pbStack_18->precision < xs - x2) || (e2 == x2)) ||
              (waiting == (TProfileList)xs)) ||
             ((e2 <= (long)waiting && (waiting != (TProfileList)(e2 + pbStack_18->precision))))) {
            (*pbStack_18->Proc_Sweep_Span)(pbStack_18,P._6_2_,x2,xs,P_Right,_bottom);
          }
          else if ((P_Right->flags & 7) != 2) {
            P_Right->X = x2;
            _bottom->X = xs;
            P_Right->countL = 1;
            x1._6_2_ = x1._6_2_ + 1;
          }
          _bottom = _bottom->link;
        }
        if (0 < x1._6_2_) {
          _bottom = pTStack_90;
          for (P_Right = draw_right; P_Right != (PProfile_conflict)0x0; P_Right = P_Right->link) {
            if (P_Right->countL != 0) {
              P_Right->countL = 0;
              (*pbStack_18->Proc_Sweep_Drop)
                        (pbStack_18,P._6_2_,P_Right->X,_bottom->X,P_Right,_bottom);
            }
            _bottom = _bottom->link;
          }
        }
        (*pbStack_18->Proc_Sweep_Step)(pbStack_18);
        P._6_2_ = P._6_2_ + 1;
        if (P._6_2_ < P._4_2_) {
          Sort(&draw_right);
          Sort(&stack0xffffffffffffff70);
        }
      }
      Q = draw_right;
      while (Q != (PProfile_conflict)0x0) {
        P_Left = Q->link;
        if (Q->height == 0) {
          DelOld(&draw_right,Q);
        }
        Q = P_Left;
      }
      Q = pTStack_90;
      while (Q != (PProfile_conflict)0x0) {
        P_Left = Q->link;
        if (Q->height == 0) {
          DelOld(&stack0xffffffffffffff70,Q);
        }
        Q = P_Left;
      }
    }
    for (; P._6_2_ <= local_44; P._6_2_ = P._6_2_ + 1) {
      (*pbStack_18->Proc_Sweep_Step)(pbStack_18);
    }
    worker_local._7_1_ = '\0';
  }
  return worker_local._7_1_;
}

Assistant:

static Bool
  Draw_Sweep( RAS_ARG )
  {
    Short         y, y_change, y_height;

    PProfile      P, Q, P_Left, P_Right;

    Short         min_Y, max_Y, top, bottom, dropouts;

    Long          x1, x2, xs, e1, e2;

    TProfileList  waiting;
    TProfileList  draw_left, draw_right;


    /* initialize empty linked lists */

    Init_Linked( &waiting );

    Init_Linked( &draw_left  );
    Init_Linked( &draw_right );

    /* first, compute min and max Y */

    P     = ras.fProfile;
    max_Y = (Short)TRUNC( ras.minY );
    min_Y = (Short)TRUNC( ras.maxY );

    while ( P )
    {
      Q = P->link;

      bottom = (Short)P->start;
      top    = (Short)( P->start + P->height - 1 );

      if ( min_Y > bottom )
        min_Y = bottom;
      if ( max_Y < top )
        max_Y = top;

      P->X = 0;
      InsNew( &waiting, P );

      P = Q;
    }

    /* check the Y-turns */
    if ( ras.numTurns == 0 )
    {
      ras.error = FT_THROW( Invalid );
      return FAILURE;
    }

    /* now initialize the sweep */

    ras.Proc_Sweep_Init( RAS_VARS &min_Y, &max_Y );

    /* then compute the distance of each profile from min_Y */

    P = waiting;

    while ( P )
    {
      P->countL = P->start - min_Y;
      P = P->link;
    }

    /* let's go */

    y        = min_Y;
    y_height = 0;

    if ( ras.numTurns > 0                     &&
         ras.sizeBuff[-ras.numTurns] == min_Y )
      ras.numTurns--;

    while ( ras.numTurns > 0 )
    {
      /* check waiting list for new activations */

      P = waiting;

      while ( P )
      {
        Q = P->link;
        P->countL -= y_height;
        if ( P->countL == 0 )
        {
          DelOld( &waiting, P );

          if ( P->flags & Flow_Up )
            InsNew( &draw_left,  P );
          else
            InsNew( &draw_right, P );
        }

        P = Q;
      }

      /* sort the drawing lists */

      Sort( &draw_left );
      Sort( &draw_right );

      y_change = (Short)ras.sizeBuff[-ras.numTurns--];
      y_height = (Short)( y_change - y );

      while ( y < y_change )
      {
        /* let's trace */

        dropouts = 0;

        P_Left  = draw_left;
        P_Right = draw_right;

        while ( P_Left )
        {
          x1 = P_Left ->X;
          x2 = P_Right->X;

          if ( x1 > x2 )
          {
            xs = x1;
            x1 = x2;
            x2 = xs;
          }

          e1 = FLOOR( x1 );
          e2 = CEILING( x2 );

          if ( x2 - x1 <= ras.precision &&
               e1 != x1 && e2 != x2     )
          {
            if ( e1 > e2 || e2 == e1 + ras.precision )
            {
              Int  dropOutControl = P_Left->flags & 7;


              if ( dropOutControl != 2 )
              {
                /* a drop-out was detected */

                P_Left ->X = x1;
                P_Right->X = x2;

                /* mark profile for drop-out processing */
                P_Left->countL = 1;
                dropouts++;
              }

              goto Skip_To_Next;
            }
          }

          ras.Proc_Sweep_Span( RAS_VARS y, x1, x2, P_Left, P_Right );

        Skip_To_Next:

          P_Left  = P_Left->link;
          P_Right = P_Right->link;
        }

        /* handle drop-outs _after_ the span drawing --       */
        /* drop-out processing has been moved out of the loop */
        /* for performance tuning                             */
        if ( dropouts > 0 )
          goto Scan_DropOuts;

      Next_Line:

        ras.Proc_Sweep_Step( RAS_VAR );

        y++;

        if ( y < y_change )
        {
          Sort( &draw_left  );
          Sort( &draw_right );
        }
      }

      /* now finalize the profiles that need it */

      P = draw_left;
      while ( P )
      {
        Q = P->link;
        if ( P->height == 0 )
          DelOld( &draw_left, P );
        P = Q;
      }

      P = draw_right;
      while ( P )
      {
        Q = P->link;
        if ( P->height == 0 )
          DelOld( &draw_right, P );
        P = Q;
      }
    }

    /* for gray-scaling, flush the bitmap scanline cache */
    while ( y <= max_Y )
    {
      ras.Proc_Sweep_Step( RAS_VAR );
      y++;
    }

    return SUCCESS;

  Scan_DropOuts:

    P_Left  = draw_left;
    P_Right = draw_right;

    while ( P_Left )
    {
      if ( P_Left->countL )
      {
        P_Left->countL = 0;
#if 0
        dropouts--;  /* -- this is useful when debugging only */
#endif
        ras.Proc_Sweep_Drop( RAS_VARS y,
                                      P_Left->X,
                                      P_Right->X,
                                      P_Left,
                                      P_Right );
      }

      P_Left  = P_Left->link;
      P_Right = P_Right->link;
    }

    goto Next_Line;
  }